

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weibull_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::weibull_dist<float>::icdf(weibull_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  int *piVar2;
  float fVar3;
  result_type_conflict1 rVar4;
  
  if ((x < 0.0) || (1.0 <= x)) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
    rVar4 = NAN;
  }
  else {
    fVar1 = (this->P).theta_;
    fVar3 = log1pf(-x);
    fVar3 = powf(-fVar3,1.0 / (this->P).beta_);
    rVar4 = fVar3 * fVar1;
  }
  return rVar4;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x >= 1) {
#if !(defined __CUDA_ARCH__)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return P.theta() * math::pow(-math::ln1p(-x), 1 / P.beta());
    }